

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state_51.cpp
# Opt level: O1

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine_lua51
          (vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,
          lua_State_conflict2 *L)

{
  pointer *ppplVar1;
  iterator __position;
  GCObject_conflict *pGVar2;
  GCObject_conflict *local_20;
  
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar2 = (GCObject_conflict *)L->l_G->rootgc;
  if (pGVar2 != (GCObject_conflict *)0x0) {
    do {
      if ((pGVar2->gch).tt == '\b') {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_20 = pGVar2;
          std::vector<lua_State*,std::allocator<lua_State*>>::_M_realloc_insert<lua_State*>
                    ((vector<lua_State*,std::allocator<lua_State*>> *)__return_storage_ptr__,
                     __position,(lua_State **)&local_20);
        }
        else {
          *__position._M_current = (lua_State *)pGVar2;
          ppplVar1 = &(__return_storage_ptr__->
                      super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *ppplVar1 = *ppplVar1 + 1;
        }
      }
      pGVar2 = (pGVar2->gch).next;
    } while (pGVar2 != (GCObject_conflict *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine_lua51(lua_State* L)
{
	std::vector<lua_State*> result;
	auto head = G(L)->rootgc;

	while (head)
	{
		if (head->gch.tt == LUA_TTHREAD)
		{
			result.push_back(reinterpret_cast<lua_State*>(head));
		}
		head = head->gch.next;
	}

	return result;
}